

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::ArenaTest_MoveCtorOnArena_Test::~ArenaTest_MoveCtorOnArena_Test
          (ArenaTest_MoveCtorOnArena_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ArenaTest, MoveCtorOnArena) {
  Arena arena;

  ASSERT_EQ(arena.SpaceUsed(), 0);

  auto* original = Arena::Create<NestedTestAllTypes>(&arena);
  TestUtil::SetAllFields(original->mutable_payload());
  TestUtil::ExpectAllFieldsSet(original->payload());

  auto usage_original = arena.SpaceUsed();
  auto* moved = Arena::Create<NestedTestAllTypes>(&arena, std::move(*original));
  auto usage_by_move = arena.SpaceUsed() - usage_original;

  TestUtil::ExpectAllFieldsSet(moved->payload());

  // The only extra allocation with moves is sizeof(NestedTestAllTypes).
  EXPECT_EQ(usage_by_move, sizeof(NestedTestAllTypes));
  EXPECT_LT(usage_by_move + sizeof(TestAllTypes), usage_original);

  // Status after move is unspecified and must not be assumed. It's merely
  // checking current implementation specifics for protobuf internal.
  TestUtil::ExpectClear(original->payload());
}